

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

void Vga_ManAddClausesOne(Vta_Man_t *p,int iObj,int iFrame)

{
  int iVar1;
  Vta_Obj_t *pVVar2;
  ulong uVar3;
  Gia_Man_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Vta_Obj_t *pVVar6;
  Vta_Obj_t *pVVar7;
  uint uVar8;
  Vta_Obj_t **end;
  uint Entry;
  uint uVar9;
  int iVar10;
  long lVar11;
  sat_solver2 *s;
  int in_R8D;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  int local_4c;
  uint local_48;
  undefined1 local_44 [4];
  Vta_Obj_t *local_40;
  sat_solver2 *local_38;
  
  if ((iObj < 0) || (p->pGia->nObjs <= iObj)) {
LAB_00626089:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar12 = p->pGia->pObjs + (uint)iObj;
  pVVar6 = Vga_ManFindOrAdd(p,iObj,iFrame);
  pVVar2 = p->pObjs;
  if ((pVVar6 <= pVVar2) || (pVVar2 + p->nObjs <= pVVar6)) goto LAB_0062606a;
  if ((pVVar6->iObj != iObj) || (pVVar6->iFrame != iFrame)) {
    __assert_fail("pThis->iObj == iObj && pThis->iFrame == iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x4ec,"void Vga_ManAddClausesOne(Vta_Man_t *, int, int)");
  }
  if ((*(uint *)&pVVar6->field_0xc >> 0x1e & 1) != 0) {
    return;
  }
  *(uint *)&pVVar6->field_0xc = *(uint *)&pVVar6->field_0xc | 0x40000000;
  Entry = (uint)((ulong)((long)pVVar6 - (long)pVVar2) >> 4);
  Vec_IntPush(p->vAddedNew,Entry);
  uVar3 = *(ulong *)pGVar12;
  uVar9 = (uint)uVar3;
  pGVar4 = p->pGia;
  if ((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) {
    pGVar5 = pGVar4->pObjs;
    if ((pGVar5 <= pGVar12) && (pGVar12 < pGVar5 + pGVar4->nObjs)) {
      pVVar6 = Vga_ManFindOrAdd(p,(int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555 -
                                  (uVar9 & 0x1fffffff),iFrame);
      pVVar2 = p->pObjs;
      if ((pVVar2 < pVVar6) && (pVVar6 < pVVar2 + p->nObjs)) {
        pGVar5 = p->pGia->pObjs;
        local_40 = pVVar2;
        if ((pGVar12 < pGVar5) || (pGVar5 + p->pGia->nObjs <= pGVar12)) goto LAB_006260c7;
        pVVar7 = Vga_ManFindOrAdd(p,(int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555
                                    - (*(uint *)&pGVar12->field_0x4 & 0x1fffffff),iFrame);
        pVVar2 = p->pObjs;
        if ((pVVar2 < pVVar7) && (pVVar7 < pVVar2 + p->nObjs)) {
          uVar13 = (long)pVVar6 - (long)local_40;
          local_38 = p->pSat;
          uVar3 = *(ulong *)pGVar12;
          local_40 = (Vta_Obj_t *)CONCAT44(local_40._4_4_,Entry * 2);
          iVar10 = Entry * 2 + 1;
          uVar8 = (uint)(uVar13 >> 3) & 0xfffffffe | (uint)(uVar3 >> 0x1d) & 1;
          local_4c = iVar10;
          local_48 = uVar8;
          sat_solver2_addclause(local_38,&local_4c,(lit *)local_44,Entry);
          s = local_38;
          uVar9 = (uint)((ulong)((long)pVVar7 - (long)pVVar2) >> 3) & 0xfffffffe |
                  (uint)(uVar3 >> 0x3d) & 1;
          local_4c = iVar10;
          local_48 = uVar9;
          sat_solver2_addclause(local_38,&local_4c,(lit *)local_44,Entry);
          local_4c = (int)local_40;
          local_48 = uVar8 ^ 1;
          local_44 = (undefined1  [4])(uVar9 ^ 1);
          end = &local_40;
          goto LAB_00625eae;
        }
      }
LAB_0062606a:
      __assert_fail("pObj > p->pObjs && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x69,"int Vta_ObjId(Vta_Man_t *, Vta_Obj_t *)");
    }
LAB_006260c7:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if ((~uVar9 & 0x9fffffff) == 0) {
    uVar8 = (uint)(uVar3 >> 0x20) & 0x1fffffff;
    iVar10 = pGVar4->vCis->nSize;
    if (iVar10 - pGVar4->nRegs <= (int)uVar8) {
      if (iFrame == 0) {
        if (p->pPars->fUseTermVars == 0) {
          sat_solver2_add_const(p->pSat,Entry,Entry,uVar9,in_R8D);
          return;
        }
        pVVar6 = Vga_ManFindOrAdd(p,iObj,-1);
        pVVar2 = p->pObjs;
        if ((pVVar6 <= pVVar2) || (pVVar2 + p->nObjs <= pVVar6)) goto LAB_0062606a;
        if ((int)Entry < 0) {
          __assert_fail("iVar >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                        ,0x166,
                        "int sat_solver2_add_constraint(sat_solver2 *, int, int, int, int, int)");
        }
        s = p->pSat;
        iVar10 = Entry * 2 + 1;
        end = (Vta_Obj_t **)local_44;
        uVar9 = (uint)((ulong)((long)pVVar6 - (long)pVVar2) >> 3);
        local_48 = uVar9 & 0xfffffffe;
        local_4c = iVar10;
        sat_solver2_addclause(s,&local_4c,(lit *)end,Entry);
        local_48 = uVar9 | 1;
        local_4c = iVar10;
      }
      else {
        iVar1 = pGVar4->vCos->nSize;
        uVar8 = (iVar1 - iVar10) + uVar8;
        if (((int)uVar8 < 0) || (iVar1 <= (int)uVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar10 = pGVar4->vCos->pArray[uVar8];
        lVar11 = (long)iVar10;
        if ((lVar11 < 0) || (pGVar4->nObjs <= iVar10)) goto LAB_00626089;
        pGVar12 = pGVar4->pObjs;
        pVVar6 = Vga_ManFindOrAdd(p,iVar10 - (*(uint *)(pGVar12 + lVar11) & 0x1fffffff),iFrame + -1)
        ;
        pVVar2 = p->pObjs;
        if ((pVVar6 <= pVVar2) || (pVVar2 + p->nObjs <= pVVar6)) goto LAB_0062606a;
        uVar9 = (uint)((ulong)((long)pVVar6 - (long)pVVar2) >> 4);
        if ((int)(uVar9 | Entry) < 0) {
          __assert_fail("iVarA >= 0 && iVarB >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                        ,0x117,"int sat_solver2_add_buffer(sat_solver2 *, int, int, int, int, int)")
          ;
        }
        s = p->pSat;
        local_4c = Entry * 2;
        end = (Vta_Obj_t **)local_44;
        uVar9 = ((uint)(*(ulong *)(pGVar12 + lVar11) >> 0x1d) & 1) + uVar9 * 2;
        local_48 = uVar9 ^ 1;
        sat_solver2_addclause(s,&local_4c,(lit *)end,Entry);
        local_4c = Entry * 2 + 1;
        local_48 = uVar9;
      }
      goto LAB_00625eae;
    }
  }
  if ((~uVar3 & 0x1fffffff1fffffff) != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x513,"void Vga_ManAddClausesOne(Vta_Man_t *, int, int)");
  }
  if ((int)Entry < 0) {
    __assert_fail("iVar >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                  ,0x10b,"int sat_solver2_add_const(sat_solver2 *, int, int, int, int)");
  }
  s = p->pSat;
  end = (Vta_Obj_t **)&local_48;
  local_4c = Entry * 2 + 1;
LAB_00625eae:
  sat_solver2_addclause(s,&local_4c,(lit *)end,Entry);
  return;
}

Assistant:

void Vga_ManAddClausesOne( Vta_Man_t * p, int iObj, int iFrame )
{ 
    Vta_Obj_t * pThis0, * pThis1;
    Gia_Obj_t * pObj = Gia_ManObj( p->pGia, iObj );
    Vta_Obj_t * pThis = Vga_ManFindOrAdd( p, iObj, iFrame );
    int iThis0, iMainVar = Vta_ObjId(p, pThis);
    assert( pThis->iObj == iObj && pThis->iFrame == iFrame );
    if ( pThis->fAdded )
        return;
    pThis->fAdded = 1;
    Vec_IntPush( p->vAddedNew, iMainVar );
    if ( Gia_ObjIsAnd(pObj) )
    {
        pThis0 = Vga_ManFindOrAdd( p, Gia_ObjFaninId0p(p->pGia, pObj), iFrame );
        iThis0 = Vta_ObjId(p, pThis0);
        pThis1 = Vga_ManFindOrAdd( p, Gia_ObjFaninId1p(p->pGia, pObj), iFrame );
        sat_solver2_add_and( p->pSat, iMainVar, iThis0, Vta_ObjId(p, pThis1), 
            Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0, iMainVar );
    }
    else if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        if ( iFrame == 0 )
        {
            if ( p->pPars->fUseTermVars )
            {
                pThis0 = Vga_ManFindOrAdd( p, iObj, -1 );
                sat_solver2_add_constraint( p->pSat, iMainVar, Vta_ObjId(p, pThis0), 1, 0, iMainVar );
            }
            else
            {
                sat_solver2_add_const( p->pSat, iMainVar, 1, 0, iMainVar );
            }
        }
        else
        {
            pObj = Gia_ObjRoToRi( p->pGia, pObj );
            pThis0 = Vga_ManFindOrAdd( p, Gia_ObjFaninId0p(p->pGia, pObj), iFrame-1 );
            sat_solver2_add_buffer( p->pSat, iMainVar, Vta_ObjId(p, pThis0), Gia_ObjFaninC0(pObj), 0, iMainVar );  
        }
    }
    else if ( Gia_ObjIsConst0(pObj) )
    {
        sat_solver2_add_const( p->pSat, iMainVar, 1, 0, iMainVar );
    }
    else //if ( !Gia_ObjIsPi(p->pGia, pObj) )
        assert( 0 );
}